

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_auth.cc
# Opt level: O0

void __thiscall
prometheus::BasicAuthHandler::WriteUnauthorizedResponse(BasicAuthHandler *this,mg_connection *conn)

{
  undefined8 uVar1;
  mg_connection *conn_local;
  BasicAuthHandler *this_local;
  
  mg_printf(conn,"HTTP/1.1 401 Unauthorized\r\n");
  uVar1 = std::__cxx11::string::c_str();
  mg_printf(conn,"WWW-Authenticate: Basic realm=\"%s\"\r\n",uVar1);
  mg_printf(conn,"Connection: close\r\n");
  mg_printf(conn,"Content-Length: 0\r\n");
  mg_printf(conn,"\r\n");
  return;
}

Assistant:

void BasicAuthHandler::WriteUnauthorizedResponse(mg_connection* conn) {
  mg_printf(conn, "HTTP/1.1 401 Unauthorized\r\n");
  mg_printf(conn, "WWW-Authenticate: Basic realm=\"%s\"\r\n", realm_.c_str());
  mg_printf(conn, "Connection: close\r\n");
  mg_printf(conn, "Content-Length: 0\r\n");
  // end headers
  mg_printf(conn, "\r\n");
}